

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O2

void __thiscall
JAMA::Eigenvalue<double>::Eigenvalue(Eigenvalue<double> *this,DynamicRectMatrix<double> *A)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  int j;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int i;
  long lVar8;
  ulong uVar9;
  allocator_type local_79;
  _Vector_base<double,_std::allocator<double>_> local_78;
  DynamicVector<double,_std::allocator<double>_> *local_60;
  DynamicVector<double,_std::allocator<double>_> *local_58;
  DynamicRectMatrix<double> local_50;
  DynamicRectMatrix<double> local_40;
  
  local_58 = &this->d;
  local_60 = &this->ort;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H).data_ = (double **)0x0;
  (this->H).nrow_ = 0;
  (this->H).ncol_ = 0;
  (this->V).data_ = (double **)0x0;
  (this->V).nrow_ = 0;
  (this->V).ncol_ = 0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = A->ncol_;
  this->n = uVar1;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_78,uVar1,uVar1);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_40,&this->V);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,(long)this->n,&local_79);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&local_58->data_,&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,(long)this->n,&local_79);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->e).data_,&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  this->issymmetric = 1;
  uVar1 = this->n;
  uVar7 = 1;
  lVar4 = 0;
  while ((lVar4 < (int)uVar1 && (uVar7 != 0))) {
    ppdVar2 = A->data_;
    lVar8 = 0;
    while ((lVar8 < (int)uVar1 && (uVar7 != 0))) {
      uVar7 = -(uint)(ppdVar2[lVar4][lVar8] == ppdVar2[lVar8][lVar4]) & 1;
      this->issymmetric = uVar7;
      lVar8 = lVar8 + 1;
    }
    lVar4 = lVar4 + 1;
  }
  if (uVar7 == 0) {
    OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
              ((DynamicRectMatrix<double> *)&local_78,uVar1,uVar1);
    OpenMD::DynamicRectMatrix<double>::operator=(&local_50,&this->H);
    OpenMD::DynamicRectMatrix<double>::deallocate(&local_50);
    OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_78);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,(long)this->n,&local_79);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&local_60->data_,&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    uVar1 = this->n;
    uVar6 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      ppdVar2 = A->data_;
      ppdVar3 = (this->H).data_;
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        ppdVar3[uVar9][uVar6] = ppdVar2[uVar9][uVar6];
      }
    }
    orthes(this);
    hqr2(this);
  }
  else {
    uVar5 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      ppdVar2 = A->data_;
      ppdVar3 = (this->V).data_;
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        ppdVar3[uVar5][uVar9] = ppdVar2[uVar5][uVar9];
      }
    }
    tred2(this);
    tql2(this);
  }
  return;
}

Assistant:

Eigenvalue(const DynamicRectMatrix<Real>& A) {
      n = A.getNCol();
      V = DynamicRectMatrix<Real>(n, n);
      d = DynamicVector<Real>(n);
      e = DynamicVector<Real>(n);

      issymmetric = 1;
      for (int j = 0; (j < n) && issymmetric; j++) {
        for (int i = 0; (i < n) && issymmetric; i++) {
          issymmetric = (A(i, j) == A(j, i));
        }
      }

      if (issymmetric) {
        for (int i = 0; i < n; i++) {
          for (int j = 0; j < n; j++) {
            V(i, j) = A(i, j);
          }
        }

        // Tridiagonalize.
        tred2();

        // Diagonalize.
        tql2();

      } else {
        H   = DynamicRectMatrix<Real>(n, n);
        ort = DynamicVector<Real>(n);

        for (int j = 0; j < n; j++) {
          for (int i = 0; i < n; i++) {
            H(i, j) = A(i, j);
          }
        }

        // Reduce to Hessenberg form.
        orthes();

        // Reduce Hessenberg to real Schur form.
        hqr2();
      }
    }